

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O0

void amrex::Assert_host(char *EX,char *file,int line,char *msg)

{
  runtime_error *this;
  long in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  char buf [512];
  int N;
  char local_228 [440];
  char *in_stack_ffffffffffffff90;
  
  if (in_RCX == 0) {
    snprintf(local_228,0x200,"Assertion `%s\' failed, file \"%s\", line %d",in_RDI,in_RSI,
             (ulong)in_EDX);
  }
  else {
    snprintf(local_228,0x200,"Assertion `%s\' failed, file \"%s\", line %d, Msg: %s",in_RDI,in_RSI,
             (ulong)in_EDX);
  }
  if (system::error_handler == (code *)0x0) {
    if (system::throw_exception != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,local_228);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    write_to_stderr_without_buffering(in_stack_ffffffffffffff90);
    ParallelDescriptor::Abort(0,true);
  }
  else {
    (*system::error_handler)(local_228);
  }
  return;
}

Assistant:

void
amrex::Assert_host (const char* EX, const char* file, int line, const char* msg)
{
    const int N = 512;

    char buf[N];

    if (msg) {
        snprintf(buf,
                 N,
                 "Assertion `%s' failed, file \"%s\", line %d, Msg: %s",
                 EX,
                 file,
                 line,
                 msg);
    } else {
        snprintf(buf,
                 N,
                 "Assertion `%s' failed, file \"%s\", line %d",
                 EX,
                 file,
                 line);
    }

    if (system::error_handler) {
        system::error_handler(buf);
    } else if (system::throw_exception) {
        throw RuntimeError(buf);
    } else {
       write_to_stderr_without_buffering(buf);
#ifdef AMREX_USE_OMP
#pragma omp critical (amrex_abort_omp_critical)
#endif
       ParallelDescriptor::Abort();
   }
}